

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.h
# Opt level: O2

bool __thiscall
CCommandBuffer::AddCommand<CCommandBuffer::CScreenshotCommand>
          (CCommandBuffer *this,CScreenshotCommand *Command)

{
  CCommand *pCVar1;
  CCommand *pCVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  CCommand *pCVar6;
  
  pCVar6 = (CCommand *)CBuffer::Alloc(&this->m_CmdBuffer,0x28,8);
  if (pCVar6 != (CCommand *)0x0) {
    uVar3 = *(undefined4 *)&(Command->super_CCommand).field_0x4;
    pCVar1 = (Command->super_CCommand).m_pNext;
    iVar4 = Command->m_X;
    iVar5 = Command->m_Y;
    pCVar2 = *(CCommand **)&Command->m_W;
    pCVar6->m_Cmd = (Command->super_CCommand).m_Cmd;
    *(undefined4 *)&pCVar6->field_0x4 = uVar3;
    pCVar6->m_pNext = pCVar1;
    *(CImageInfo **)(pCVar6 + 2) = Command->m_pImage;
    pCVar6[1].m_Cmd = iVar4;
    *(int *)&pCVar6[1].field_0x4 = iVar5;
    pCVar6[1].m_pNext = pCVar2;
    pCVar6->m_pNext = (CCommand *)0x0;
    if (this->m_pCmdBufferTail != (CCommand *)0x0) {
      this->m_pCmdBufferTail->m_pNext = pCVar6;
    }
    if (this->m_pCmdBufferHead == (CCommand *)0x0) {
      this->m_pCmdBufferHead = pCVar6;
    }
    this->m_pCmdBufferTail = pCVar6;
  }
  return pCVar6 != (CCommand *)0x0;
}

Assistant:

bool AddCommand(const T &Command)
	{
		// make sure that we don't do something stupid like ->AddCommand(&Cmd);
		(void)static_cast<const CCommand *>(&Command);

		// allocate and copy the command into the buffer
		T *pCmd = (T *)m_CmdBuffer.Alloc(sizeof(*pCmd), 8); // TODO: use alignof(T)
		if(!pCmd)
			return false;
		*pCmd = Command;
		pCmd->m_pNext = 0;

		if(m_pCmdBufferTail)
			m_pCmdBufferTail->m_pNext = pCmd;
		if(!m_pCmdBufferHead)
			m_pCmdBufferHead = pCmd;
		m_pCmdBufferTail = pCmd;

		return true;
	}